

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_dumb.cpp
# Opt level: O1

int32 dumbfile_mem_getnc(char *ptr,int32 n,void *f)

{
  ulong uVar1;
  size_t __n;
  
  uVar1 = (ulong)(*(int *)((long)f + 0xc) - *(uint *)((long)f + 8));
  __n = (long)n;
  if ((long)uVar1 < (long)n) {
    __n = uVar1;
  }
  if (__n != 0) {
    memcpy(ptr,(void *)((ulong)*(uint *)((long)f + 8) + *f),__n);
    *(int *)((long)f + 8) = *(int *)((long)f + 8) + (int)__n;
  }
  return (int)__n;
}

Assistant:

static int32 DUMBCALLBACK dumbfile_mem_getnc(char *ptr, int32 n, void *f)
{
	dumbfile_mem_status * s = (dumbfile_mem_status *) f;
	long max = s->size - s->offset;
	if (max > n) max = n;
	if (max)
	{
		memcpy(ptr, s->ptr + s->offset, max);
		s->offset += max;
	}
	return max;
}